

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCode __thiscall
PDFDocumentHandler::ScanStreamForResourcesTokens
          (PDFDocumentHandler *this,PDFStreamInput *inSourceStream,
          StringToStringMap *inMappedResourcesNames,ResourceTokenMarkerList *outResourceMarkers)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  IByteReaderWithPosition *pIVar1;
  int iVar2;
  EStatusCode EVar3;
  IByteReader *inSourceStream_00;
  LongFilePositionType LVar4;
  char *pcVar5;
  const_iterator cVar6;
  string local_e8;
  SimpleStringTokenizer tokenizer;
  BoolAndString tokenizerResult;
  ResourceTokenMarker local_80;
  BoolAndString tokenizerResult_1;
  
  inSourceStream_00 = PDFParser::CreateInputStreamReader(this->mParser,inSourceStream);
  if (inSourceStream_00 == (IByteReader *)0x0) {
    EVar3 = eFailure;
  }
  else {
    pIVar1 = this->mPDFStream;
    LVar4 = PDFStreamInput::GetStreamContentStart(inSourceStream);
    (*(pIVar1->super_IByteReader)._vptr_IByteReader[4])(pIVar1,LVar4);
    SimpleStringTokenizer::SimpleStringTokenizer(&tokenizer);
    SimpleStringTokenizer::SetReadStream(&tokenizer,inSourceStream_00);
    tokenizerResult.first = false;
    tokenizerResult.second._M_dataplus._M_p = (pointer)&tokenizerResult.second.field_2;
    tokenizerResult.second._M_string_length = 0;
    tokenizerResult.second.field_2._M_local_buf[0] = '\0';
    this_00 = &tokenizerResult_1.second;
    while( true ) {
      iVar2 = (*inSourceStream_00->_vptr_IByteReader[3])(inSourceStream_00);
      if ((char)iVar2 == '\0') break;
      SimpleStringTokenizer::GetNextToken_abi_cxx11_(&tokenizerResult_1,&tokenizer);
      if (tokenizerResult_1.first == false) {
        std::__cxx11::string::~string((string *)this_00);
        break;
      }
      pcVar5 = (char *)std::__cxx11::string::at((ulong)this_00);
      if (*pcVar5 == '/') {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)this_00);
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&inMappedResourcesNames->_M_t,&local_80.ResourceToken);
        std::__cxx11::string::~string((string *)&local_80);
        if ((_Rb_tree_header *)cVar6._M_node !=
            &(inMappedResourcesNames->_M_t)._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)this_00);
          LVar4 = SimpleStringTokenizer::GetRecentTokenPosition(&tokenizer);
          ResourceTokenMarker::ResourceTokenMarker(&local_80,&local_e8,LVar4);
          std::__cxx11::list<ResourceTokenMarker,_std::allocator<ResourceTokenMarker>_>::push_back
                    (outResourceMarkers,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_e8);
        }
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    (*inSourceStream_00->_vptr_IByteReader[1])(inSourceStream_00);
    std::__cxx11::string::~string((string *)&tokenizerResult.second);
    SimpleStringTokenizer::~SimpleStringTokenizer(&tokenizer);
    EVar3 = eSuccess;
  }
  return EVar3;
}

Assistant:

EStatusCode PDFDocumentHandler::ScanStreamForResourcesTokens(PDFStreamInput* inSourceStream,const StringToStringMap& inMappedResourcesNames,ResourceTokenMarkerList& outResourceMarkers)
{
	IByteReader* streamReader = mParser->CreateInputStreamReader(inSourceStream);

	if(!streamReader)
		return PDFHummus::eFailure;

	mPDFStream->SetPosition(inSourceStream->GetStreamContentStart());

	// using simplestringtokenizer instead of regular pdfparsertokenizer, as content stream may contain
	// streams, which may have tokens that will be interpreted as pdf tokens (like string start), and so will cause
	// a wrong inclusion of content and so will skip content that should be replaced.
	// There's still risk here, in that there will be a string that like a resource name with forward slash which will be mistaken
	// for a resource usage. this is something to tackle still.
	SimpleStringTokenizer tokenizer;
	tokenizer.SetReadStream(streamReader);

	BoolAndString tokenizerResult;

	while(streamReader->NotEnded())
	{
		BoolAndString tokenizerResult = tokenizer.GetNextToken();

		if(!tokenizerResult.first)
			break;

		// check if this is a token that will need replacement - 1. verify that it's a name 2. verify that it's a name in the input map
		// note that here i don't have to take care of name space chars encoding, as the names are alrady encoded in the map [the new names are never containing space chars]
		if(tokenizerResult.second.at(0) == scSlash && 
			(inMappedResourcesNames.find(tokenizerResult.second.substr(1)) != inMappedResourcesNames.end()))
				outResourceMarkers.push_back(ResourceTokenMarker(tokenizerResult.second.substr(1),tokenizer.GetRecentTokenPosition()));
	}

	delete streamReader;
	return PDFHummus::eSuccess;
}